

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void restore_workers_after_fpmt
               (AV1_PRIMARY *ppi,int parallel_frame_count,int num_fpmt_workers_prepared)

{
  LRWorkerData *pLVar1;
  uint8_t uVar2;
  int iVar3;
  AV1_COMP *pAVar4;
  RestorationLineBuffers *pRVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  lVar9 = 0;
  for (iVar8 = 0; iVar8 < parallel_frame_count; iVar8 = iVar8 + iVar3) {
    pAVar4 = ppi->parallel_cpi[lVar9];
    if ((ppi->p_mt_info).cdef_worker != (AV1CdefWorkerData *)0x0) {
      uVar2 = ((pAVar4->common).seq_params)->monochrome;
      ((pAVar4->mt_info).cdef_worker)->srcbuf = (pAVar4->mt_info).restore_state_buf.cdef_srcbuf;
      for (lVar7 = 0; (ulong)(uVar2 == '\0') * 2 + 1 != lVar7; lVar7 = lVar7 + 1) {
        ((pAVar4->mt_info).cdef_worker)->colbuf[lVar7] =
             (pAVar4->mt_info).restore_state_buf.cdef_colbuf[lVar7];
      }
    }
    iVar6 = is_restoration_used(&pAVar4->common);
    iVar3 = (pAVar4->mt_info).num_workers;
    if (iVar6 != 0) {
      pRVar5 = (pAVar4->mt_info).restore_state_buf.rlbs;
      pLVar1 = (pAVar4->mt_info).lr_row_sync.lrworkerdata + (iVar8 + iVar3 + -1);
      pLVar1->rst_tmpbuf = (pAVar4->mt_info).restore_state_buf.rst_tmpbuf;
      pLVar1->rlbs = pRVar5;
    }
    lVar9 = lVar9 + 1;
  }
  return;
}

Assistant:

static inline void restore_workers_after_fpmt(AV1_PRIMARY *ppi,
                                              int parallel_frame_count,
                                              int num_fpmt_workers_prepared) {
  assert(parallel_frame_count <= ppi->num_fp_contexts &&
         parallel_frame_count > 1);
  (void)parallel_frame_count;

  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;

  int frame_idx = 0;
  int i = 0;
  while (i < num_fpmt_workers_prepared) {
    AV1_COMP *cur_cpi = ppi->parallel_cpi[frame_idx];
    MultiThreadInfo *mt_info = &cur_cpi->mt_info;
    const AV1_COMMON *const cm = &cur_cpi->common;
    const int num_planes = av1_num_planes(cm);

    // Restore the original cdef_worker pointers.
    if (p_mt_info->cdef_worker != NULL) {
      mt_info->cdef_worker->srcbuf = mt_info->restore_state_buf.cdef_srcbuf;
      for (int plane = 0; plane < num_planes; plane++)
        mt_info->cdef_worker->colbuf[plane] =
            mt_info->restore_state_buf.cdef_colbuf[plane];
    }
#if !CONFIG_REALTIME_ONLY
    if (is_restoration_used(cm)) {
      // Restore the original LR buffers.
      int idx = i + mt_info->num_workers - 1;
      assert(idx < mt_info->lr_row_sync.num_workers);
      mt_info->lr_row_sync.lrworkerdata[idx].rst_tmpbuf =
          mt_info->restore_state_buf.rst_tmpbuf;
      mt_info->lr_row_sync.lrworkerdata[idx].rlbs =
          mt_info->restore_state_buf.rlbs;
    }
#endif

    frame_idx++;
    i += mt_info->num_workers;
  }
}